

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IRBuilder.cpp
# Opt level: O3

RegOpnd * __thiscall
IRBuilder::BuildDstOpnd
          (IRBuilder *this,RegSlot dstRegSlot,IRType type,bool isCatchObjectSym,bool reuseTemp)

{
  JITTimeWorkItem *this_00;
  BVFixed *this_01;
  code *pcVar1;
  bool bVar2;
  BOOLEAN BVar3;
  RegSlot RVar4;
  SymID SVar5;
  JITTimeFunctionBody *pJVar6;
  undefined4 *puVar7;
  StackSym *sym;
  RegOpnd *pRVar8;
  RegSlot RVar9;
  
  this_00 = this->m_func->m_workItem;
  RVar9 = dstRegSlot;
  SVar5 = dstRegSlot;
  if (dstRegSlot < this->firstTemp) {
    pJVar6 = JITTimeWorkItem::GetJITFunctionBody(this_00);
    bVar2 = JITTimeFunctionBody::RegIsConstant(pJVar6,dstRegSlot);
    if (bVar2) {
      RVar9 = 0xffffffff;
    }
    else {
      bVar2 = JITTimeWorkItem::IsLoopBody(this->m_func->m_workItem);
      if (bVar2) {
        SetLoopBodyStSlot(this,dstRegSlot,isCatchObjectSym);
        EnsureLoopBodyLoadSlot(this,dstRegSlot,isCatchObjectSym);
      }
    }
  }
  else {
    bVar2 = JITTimeWorkItem::IsLoopBody(this_00);
    if (bVar2) {
      BVar3 = BVFixed::Test(this->m_ldSlots,dstRegSlot);
      if (BVar3 != '\0') {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        puVar7 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
        *puVar7 = 1;
        bVar2 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/IRBuilder.cpp"
                           ,0x537,"(!this->m_ldSlots->Test(dstRegSlot))",
                           "!this->m_ldSlots->Test(dstRegSlot)");
        if (!bVar2) {
          pcVar1 = (code *)invalidInstructionException();
          (*pcVar1)();
        }
        *puVar7 = 0;
      }
      this_01 = this->m_usedAsTemp;
      pJVar6 = JITTimeWorkItem::GetJITFunctionBody(this->m_func->m_workItem);
      RVar4 = JITTimeFunctionBody::GetFirstTmpReg(pJVar6);
      BVFixed::Set(this_01,dstRegSlot - RVar4);
    }
    SVar5 = GetMappedTemp(this,dstRegSlot);
    if (SVar5 == 0) {
      SetMappedTemp(this,dstRegSlot,dstRegSlot);
      SVar5 = dstRegSlot;
    }
    else if (!reuseTemp) {
      SVar5 = SymTable::NewID(this->m_func->m_symTable);
      SetMappedTemp(this,dstRegSlot,SVar5);
    }
  }
  sym = StackSym::FindOrCreate(SVar5,RVar9,this->m_func,TyVar);
  sym->field_0x18 = sym->field_0x18 & 0xfb;
  pRVar8 = IR::RegOpnd::New(sym,type,this->m_func);
  return pRVar8;
}

Assistant:

IR::RegOpnd *
IRBuilder::BuildDstOpnd(Js::RegSlot dstRegSlot, IRType type, bool isCatchObjectSym, bool reuseTemp)
{
    StackSym *   symDst;
    SymID        symID;

    if (this->RegIsTemp(dstRegSlot))
    {
#if DBG
        if (this->IsLoopBody())
        {
            // If we are doing loop body, and a temp reg slot is loaded via LdSlot
            // That means that we have detected that the slot is live coming in to the loop.
            // This would only happen for the value of a "with" statement, so there shouldn't
            // be any def for those
            Assert(!this->m_ldSlots->Test(dstRegSlot));
            this->m_usedAsTemp->Set(dstRegSlot - m_func->GetJITFunctionBody()->GetFirstTmpReg());
        }
#endif

        // This is a def of a temp. Create a new sym ID for it if it's been used since its last def.
        //     !!!NOTE: always process an instruction's temp uses before its temp defs!!!

        symID = this->GetMappedTemp(dstRegSlot);
        if (symID == 0)
        {
            // First time we've seen the temp. Just use the number that the front end gave it.
            symID = static_cast<SymID>(dstRegSlot);
            this->SetMappedTemp(dstRegSlot, symID);
        }
        else if (!reuseTemp)
        {
            // Byte code has not told us to reuse the mapped temp at this def, so don't. Make a new one.
            symID = m_func->m_symTable->NewID();
            this->SetMappedTemp(dstRegSlot, symID);
        }
    }
    else
    {
        symID = static_cast<SymID>(dstRegSlot);
        if (this->RegIsConstant(dstRegSlot))
        {
            // Don't need to track constant registers for bailout. Don't set the byte code register for constant.
            dstRegSlot = Js::Constants::NoRegister;
        }
        else if (IsLoopBody())
        {
            // Loop body and not constants
            this->SetLoopBodyStSlot(symID, isCatchObjectSym);

            // We need to make sure that the symbols is loaded as well
            // so that the sym will be defined on all path.
            this->EnsureLoopBodyLoadSlot(symID, isCatchObjectSym);
        }
    }

    symDst = StackSym::FindOrCreate(symID, dstRegSlot, m_func);

    // Always reset isSafeThis to false.  We'll set it to true for singleDef cases,
    // but want to reset it to false if it is multi-def.
    // NOTE: We could handle the multiDef if they are all safe, but it probably isn't very common.
    symDst->m_isSafeThis = false;

    IR::RegOpnd *regOpnd =  IR::RegOpnd::New(symDst, type, m_func);
    return regOpnd;
}